

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

double __thiscall soplex::SVectorBase<double>::maxAbs(SVectorBase<double> *this)

{
  SVectorBase<double> *in_RDI;
  Real RVar1;
  int i;
  double maxi;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  local_14 = size(in_RDI);
  while (local_14 = local_14 + -1, -1 < local_14) {
    RVar1 = spxAbs<double>(in_RDI->m_elem[local_14].val);
    if (local_10 < RVar1) {
      local_10 = spxAbs<double>(in_RDI->m_elem[local_14].val);
    }
  }
  return local_10;
}

Assistant:

R maxAbs() const
   {
      R maxi = 0;

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) > maxi)
            maxi = spxAbs(m_elem[i].val);
      }

      assert(maxi >= 0);

      return maxi;
   }